

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.h
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::setAngularLowerLimit
          (btGeneric6DofSpring2Constraint *this,btVector3 *angularLower)

{
  btVector3 *in_RSI;
  long in_RDI;
  btScalar bVar1;
  int i;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    btVector3::operator_cast_to_float_(in_RSI);
    bVar1 = btNormalizeAngle(2.933714e-39);
    *(btScalar *)(in_RDI + 0x3e0 + (long)local_14 * 0x58) = bVar1;
  }
  return;
}

Assistant:

void setAngularLowerLimit(const btVector3& angularLower)
	{
		for(int i = 0; i < 3; i++) 
			m_angularLimits[i].m_loLimit = btNormalizeAngle(angularLower[i]);
	}